

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O1

void hex2bin(char *in,int length,char *out)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  if (0 < length) {
    lVar1 = 0;
    do {
      bVar3 = in[lVar1 + 1];
      bVar4 = (bVar3 & 0xdf) - 0x37;
      if ((bVar3 & 0x40) == 0) {
        bVar4 = bVar3 & 0xf;
      }
      bVar2 = in[lVar1] * '\x10';
      bVar3 = bVar2 + 0x90;
      if ((in[lVar1] & 0x40U) == 0) {
        bVar3 = bVar2;
      }
      *out = bVar3 | bVar4;
      out = (char *)((byte *)out + 1);
      lVar1 = lVar1 + 2;
    } while ((int)lVar1 < length);
  }
  return;
}

Assistant:

void hex2bin(const char *in, int length, char *out) {
	for (int i = 0; i < length; i += 2) {
		char nibble1 = parseNibble(*in++);
		char nibble2 = parseNibble(*in++);
		*out++ = nibble1 << 4 | nibble2;
	}
}